

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_add_with_descr(REF_GEOM ref_geom,REF_INT *descr,REF_DBL *param)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom;
  REF_INT node;
  REF_INT degen;
  REF_INT jump;
  REF_INT gref;
  REF_INT id;
  REF_INT type;
  REF_DBL *param_local;
  REF_INT *descr_local;
  REF_GEOM ref_geom_local;
  
  gref = *descr;
  jump = descr[1];
  degen = descr[2];
  node = descr[3];
  geom = descr[4];
  ref_private_macro_code_rss = descr[5];
  _id = param;
  param_local = (REF_DBL *)descr;
  descr_local = &ref_geom->n;
  uVar1 = ref_geom_add(ref_geom,ref_private_macro_code_rss,gref,jump,param);
  if (uVar1 == 0) {
    ref_geom_local._4_4_ =
         ref_geom_find((REF_GEOM)descr_local,ref_private_macro_code_rss,gref,jump,
                       &ref_private_macro_code_rss_1);
    if (ref_geom_local._4_4_ == 0) {
      *(REF_INT *)(*(long *)(descr_local + 4) + (long)(ref_private_macro_code_rss_1 * 6 + 2) * 4) =
           degen;
      *(REF_INT *)(*(long *)(descr_local + 4) + (long)(ref_private_macro_code_rss_1 * 6 + 4) * 4) =
           geom;
      *(REF_INT *)(*(long *)(descr_local + 4) + (long)(ref_private_macro_code_rss_1 * 6 + 3) * 4) =
           node;
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1f9,
             "ref_geom_add_with_descr",(ulong)ref_geom_local._4_4_,"geom find");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x1f8,
           "ref_geom_add_with_descr",(ulong)uVar1,"geom add");
    ref_geom_local._4_4_ = uVar1;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_add_with_descr(REF_GEOM ref_geom, REF_INT *descr,
                                           REF_DBL *param) {
  REF_INT type, id, gref, jump, degen, node, geom;
  type = descr[REF_GEOM_DESCR_TYPE];
  id = descr[REF_GEOM_DESCR_ID];
  gref = descr[REF_GEOM_DESCR_GREF];
  jump = descr[REF_GEOM_DESCR_JUMP];
  degen = descr[REF_GEOM_DESCR_DEGEN];
  node = descr[REF_GEOM_DESCR_NODE];
  RSS(ref_geom_add(ref_geom, node, type, id, param), "geom add");
  RSS(ref_geom_find(ref_geom, node, type, id, &geom), "geom find");
  ref_geom_gref(ref_geom, geom) = gref;
  ref_geom_degen(ref_geom, geom) = degen;
  ref_geom_jump(ref_geom, geom) = jump;
  return REF_SUCCESS;
}